

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase211::run(TestCase211 *this)

{
  Orphanage OVar1;
  char *local_1c0;
  Fault f;
  Builder root;
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition;
  bool local_148;
  Orphan<capnp::Text> orphan;
  Builder local_118;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  OVar1 = MessageBuilder::getOrphanage(&builder.super_MessageBuilder);
  OrphanBuilder::initText((OrphanBuilder *)&_kjCondition,OVar1.arena,OVar1.capTable,8);
  orphan.builder.capTable = (CapTableBuilder *)_kjCondition.op.content.ptr;
  orphan.builder.location = (word *)_kjCondition.op.content.size_;
  orphan.builder.tag.content = _kjCondition._0_8_;
  orphan.builder.segment = (SegmentBuilder *)_kjCondition.right;
  OrphanBuilder::asText((Builder *)&root,&orphan.builder);
  _kjCondition.right = (long)root._builder.data - 1;
  _kjCondition.left = 8;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 8;
  if (_kjCondition.result) {
    OrphanBuilder::asText((Builder *)&_kjCondition,&orphan.builder);
    *(undefined8 *)_kjCondition.right = 0x3837363534333231;
    MessageBuilder::getRootInternal((Builder *)&f,&builder.super_MessageBuilder);
    _kjCondition._0_8_ = f.exception;
    PointerBuilder::initStruct(&root._builder,(PointerBuilder *)&_kjCondition,(StructSize)0x140006);
    _kjCondition._0_8_ = root._builder.segment;
    _kjCondition.right = (unsigned_long)root._builder.capTable;
    _kjCondition.op.content.ptr = (char *)root._builder.pointers;
    PointerBuilder::adopt((PointerBuilder *)&_kjCondition,&orphan.builder);
    local_1c0 = "12345678";
    f.exception = (Exception *)root._builder.segment;
    PointerBuilder::getBlob<capnp::Text>(&local_118,(PointerBuilder *)&f,(void *)0x0,0);
    kj::_::DebugExpression<char_const(&)[9]>::operator==
              ((DebugComparison<const_char_(&)[9],_capnp::Text::Builder> *)&_kjCondition,
               (DebugExpression<char_const(&)[9]> *)&local_1c0,&local_118);
    if ((local_148 == false) && (kj::_::Debug::minSeverity < 3)) {
      f.exception = (Exception *)root._builder.segment;
      PointerBuilder::getBlob<capnp::Text>(&local_118,(PointerBuilder *)&f,(void *)0x0,0);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<char_const(&)[9],capnp::Text::Builder>&,char_const(&)[9],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0xdc,ERROR,
                 "\"failed: expected \" \"(\\\"12345678\\\") == (root.getTextField())\", _kjCondition, \"12345678\", root.getTextField()"
                 ,(char (*) [55])"failed: expected (\"12345678\") == (root.getTextField())",
                 (DebugComparison<const_char_(&)[9],_capnp::Text::Builder> *)&_kjCondition,
                 (char (*) [9])"12345678",&local_118);
    }
    if (orphan.builder.segment != (SegmentBuilder *)0x0) {
      OrphanBuilder::euthanize(&orphan.builder);
    }
    MallocMessageBuilder::~MallocMessageBuilder(&builder);
    return;
  }
  local_1c0 = (char *)CONCAT44(local_1c0._4_4_,8);
  OrphanBuilder::asText((Builder *)&root,&orphan.builder);
  local_118._0_8_ = (long)root._builder.data + -1;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
             ,0xd7,FAILED,"(8u) == (orphan.get().size())","_kjCondition,8u, orphan.get().size()",
             &_kjCondition,(uint *)&local_1c0,(unsigned_long *)&local_118);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(Orphans, OrphanageText) {
  MallocMessageBuilder builder;

  Orphan<Text> orphan = builder.getOrphanage().newOrphan<Text>(8);
  ASSERT_EQ(8u, orphan.get().size());
  memcpy(orphan.get().begin(), "12345678", 8);

  auto root = builder.initRoot<TestAllTypes>();
  root.adoptTextField(kj::mv(orphan));
  EXPECT_EQ("12345678", root.getTextField());
}